

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_mobj.cpp
# Opt level: O2

int __thiscall AActor::ApplyDamageFactor(AActor *this,FName *damagetype,int damage)

{
  PClass *pPVar1;
  int damage_00;
  FName local_14;
  
  damage_00 = (int)((double)damage * this->DamageFactor);
  if (0 < damage_00) {
    pPVar1 = DObject::GetClass((DObject *)this);
    damage_00 = DamageTypeDefinition::ApplyMobjDamageFactor
                          (damage_00,&local_14,
                           (DmgFactors *)
                           pPVar1[1].super_PNativeStruct.super_PStruct.super_PNamedType.
                           super_PCompoundType.super_PType.HashNext);
  }
  return damage_00;
}

Assistant:

int AActor::ApplyDamageFactor(FName damagetype, int damage) const
{
	damage = int(damage * DamageFactor);
	if (damage > 0)
	{
		damage = DamageTypeDefinition::ApplyMobjDamageFactor(damage, damagetype, GetClass()->DamageFactors);
	}
	return damage;
}